

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  ImGuiWindow *window_00;
  ImGuiContext_conflict *pIVar1;
  bool bVar2;
  ImRect *local_50;
  bool is_clipped;
  ImGuiWindow *window;
  ImGuiContext_conflict *g;
  ImGuiItemFlags extra_flags_local;
  ImRect *nav_bb_arg_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  (pIVar1->LastItemData).Rect.Min = bb->Min;
  (pIVar1->LastItemData).Rect.Max = bb->Max;
  local_50 = bb;
  if (nav_bb_arg != (ImRect *)0x0) {
    local_50 = nav_bb_arg;
  }
  (pIVar1->LastItemData).NavRect.Min = local_50->Min;
  (pIVar1->LastItemData).NavRect.Max = local_50->Max;
  (pIVar1->LastItemData).InFlags = pIVar1->CurrentItemFlags | extra_flags;
  (pIVar1->LastItemData).StatusFlags = 0;
  if (((id != 0) &&
      ((((window_00->DC).NavLayersActiveMaskNext =
              (window_00->DC).NavLayersActiveMaskNext |
              (ushort)(1 << ((byte)(window_00->DC).NavLayerCurrent & 0x1f)), pIVar1->NavId == id ||
        ((pIVar1->NavAnyRequest & 1U) != 0)) &&
       (pIVar1->NavWindow->RootWindowForNav == window_00->RootWindowForNav)))) &&
     ((window_00 == pIVar1->NavWindow ||
      (((window_00->Flags | pIVar1->NavWindow->Flags) & 0x800000U) != 0)))) {
    NavProcessItem();
  }
  (pIVar1->NextItemData).Flags = 0;
  bVar2 = IsClippedEx(bb,id);
  if (bVar2) {
    bb_local._7_1_ = false;
  }
  else {
    if ((extra_flags & 0x100U) != 0) {
      ItemInputable(window_00,id);
    }
    bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar2) {
      (pIVar1->LastItemData).StatusFlags = (pIVar1->LastItemData).StatusFlags | 1;
    }
    bb_local._7_1_ = true;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // [WIP] Tab stop handling (previously was using internal FocusableItemRegister() api)
    // FIXME-NAV: We would now want to move this before the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (extra_flags & ImGuiItemFlags_Inputable)
        ItemInputable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}